

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O3

sexp_conflict
sexp_bytevector_ieee_double_ref_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3)

{
  ulong uVar1;
  int iVar2;
  sexp_conflict psVar3;
  
  if ((((ulong)arg1 & 3) != 0) || (arg1->tag != 8)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar3;
  }
  if (((ulong)arg2 & 1) == 0) {
    if ((((ulong)arg2 & 2) != 0) || (arg2->tag != 0xc)) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg2);
      return psVar3;
    }
    iVar2 = (int)(arg2->value).flonum_bits[0] * (int)(arg2->value).uvector.length;
  }
  else {
    iVar2 = (int)((long)arg2 >> 1);
  }
  if ((((ctx->value).type.setters)->value).type.slots != arg3) {
    uVar1 = *(ulong *)((long)&arg1->value + (long)iVar2 + 8);
    psVar3 = (sexp_conflict)
             sexp_make_flonum(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                              (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                              (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                              (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
    return psVar3;
  }
  psVar3 = (sexp_conflict)sexp_make_flonum(*(undefined8 *)((long)&arg1->value + (long)iVar2 + 8));
  return psVar3;
}

Assistant:

sexp sexp_bytevector_ieee_double_ref_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_flonum(ctx, bytevector_ieee_double_ref(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), arg3));
  return res;
}